

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathBox.h
# Opt level: O0

void __thiscall
Imath_2_5::Box<Imath_2_5::Vec3<int>_>::extendBy
          (Box<Imath_2_5::Vec3<int>_> *this,Box<Imath_2_5::Vec3<int>_> *box)

{
  int iVar1;
  int *piVar2;
  Vec3<int> *in_RSI;
  Vec3<int> *in_RDI;
  
  piVar2 = Vec3<int>::operator[](in_RSI,0);
  iVar1 = *piVar2;
  piVar2 = Vec3<int>::operator[](in_RDI,0);
  if (iVar1 < *piVar2) {
    piVar2 = Vec3<int>::operator[](in_RSI,0);
    iVar1 = *piVar2;
    piVar2 = Vec3<int>::operator[](in_RDI,0);
    *piVar2 = iVar1;
  }
  piVar2 = Vec3<int>::operator[](in_RSI + 1,0);
  iVar1 = *piVar2;
  piVar2 = Vec3<int>::operator[](in_RDI + 1,0);
  if (*piVar2 < iVar1) {
    piVar2 = Vec3<int>::operator[](in_RSI + 1,0);
    iVar1 = *piVar2;
    piVar2 = Vec3<int>::operator[](in_RDI + 1,0);
    *piVar2 = iVar1;
  }
  piVar2 = Vec3<int>::operator[](in_RSI,1);
  iVar1 = *piVar2;
  piVar2 = Vec3<int>::operator[](in_RDI,1);
  if (iVar1 < *piVar2) {
    piVar2 = Vec3<int>::operator[](in_RSI,1);
    iVar1 = *piVar2;
    piVar2 = Vec3<int>::operator[](in_RDI,1);
    *piVar2 = iVar1;
  }
  piVar2 = Vec3<int>::operator[](in_RSI + 1,1);
  iVar1 = *piVar2;
  piVar2 = Vec3<int>::operator[](in_RDI + 1,1);
  if (*piVar2 < iVar1) {
    piVar2 = Vec3<int>::operator[](in_RSI + 1,1);
    iVar1 = *piVar2;
    piVar2 = Vec3<int>::operator[](in_RDI + 1,1);
    *piVar2 = iVar1;
  }
  piVar2 = Vec3<int>::operator[](in_RSI,2);
  iVar1 = *piVar2;
  piVar2 = Vec3<int>::operator[](in_RDI,2);
  if (iVar1 < *piVar2) {
    piVar2 = Vec3<int>::operator[](in_RSI,2);
    iVar1 = *piVar2;
    piVar2 = Vec3<int>::operator[](in_RDI,2);
    *piVar2 = iVar1;
  }
  piVar2 = Vec3<int>::operator[](in_RSI + 1,2);
  iVar1 = *piVar2;
  piVar2 = Vec3<int>::operator[](in_RDI + 1,2);
  if (*piVar2 < iVar1) {
    piVar2 = Vec3<int>::operator[](in_RSI + 1,2);
    iVar1 = *piVar2;
    piVar2 = Vec3<int>::operator[](in_RDI + 1,2);
    *piVar2 = iVar1;
  }
  return;
}

Assistant:

inline void
Box<Vec3<T> >::extendBy (const Box<Vec3<T> > &box)
{
    if (box.min[0] < min[0])
        min[0] = box.min[0];

    if (box.max[0] > max[0])
        max[0] = box.max[0];

    if (box.min[1] < min[1])
        min[1] = box.min[1];

    if (box.max[1] > max[1])
        max[1] = box.max[1];

    if (box.min[2] < min[2])
        min[2] = box.min[2];

    if (box.max[2] > max[2])
        max[2] = box.max[2];
}